

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNInlineObject * CTcPrsOpUnary::parse_inline_object(int has_colon)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTPNInlineObject *pCVar3;
  int in_EDI;
  CTcParser *unaff_retaddr;
  tcprs_term_info outer_term;
  int err;
  CTPNInlineObject *obj;
  int in_stack_00000160;
  int in_stack_00000164;
  CTcSymMetaclass *in_stack_00000168;
  CTPNObjDef *in_stack_00000170;
  int *in_stack_00000178;
  CTcParser *in_stack_00000180;
  int in_stack_000001a0;
  int in_stack_000001a8;
  tcprs_term_info *in_stack_000001b0;
  tcprs_term_info *in_stack_000001b8;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  CTcTokenizer *in_stack_ffffffffffffff78;
  undefined4 in_stack_fffffffffffffff0;
  CTcSymObj *in_stack_fffffffffffffff8;
  
  pCVar3 = (CTPNInlineObject *)CTcPrsAllocObj::operator_new(0x2be848);
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.tail_ = (CTPNSuperclass *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.dst_ = (CTPNSuperclass **)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.dst_ = (CTPNObjProp **)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.sclist_.head_ = (CTPNSuperclass *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.last_ = (CTPNObjProp *)0x0;
  *(undefined8 *)&(pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.cnt_ = 0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.obj_sym_ = (CTcSymObj *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.proplist_.first_ = (CTPNObjProp *)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)0x0;
  (pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef._vptr_CTPNObjDef = (_func_int **)0x0;
  *(undefined8 *)&(pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef.field_0x48 = 0;
  CTPNInlineObject::CTPNInlineObject
            ((CTPNInlineObject *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if ((in_EDI == 0) && (tVar1 = CTcTokenizer::next(in_stack_ffffffffffffff78), tVar1 == TOKT_COLON))
  {
    in_EDI = 1;
    CTcTokenizer::next(in_stack_ffffffffffffff78);
  }
  if (in_EDI != 0) {
    CTPNObjDef::get_superclass_list(&(pCVar3->super_CTPNInlineObjectBase).super_CTPNObjDef);
    CTcParser::parse_superclass_list
              (unaff_retaddr,in_stack_fffffffffffffff8,
               (CTPNSuperclassList *)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2be930);
  if (tVar1 == TOKT_LBRACE) {
    CTcTokenizer::next(in_stack_ffffffffffffff78);
    iVar2 = CTcParser::parse_obj_prop_list
                      (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
                       in_stack_00000164,in_stack_00000160,in_stack_000001a0,in_stack_000001a8,
                       in_stack_000001b0,in_stack_000001b8);
    if (iVar2 == 0) {
      pCVar3 = (CTPNInlineObject *)0x0;
    }
  }
  else {
    CTcTokenizer::log_error_curtok
              ((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
    pCVar3 = (CTPNInlineObject *)0x0;
  }
  return pCVar3;
}

Assistant:

class CTPNInlineObject *CTcPrsOpUnary::parse_inline_object(int has_colon)
{
    /* create the inline object node */
    CTPNInlineObject *obj = new CTPNInlineObject();

    /* if the caller didn't already check for a colon, do so now */
    if (!has_colon && G_tok->next() == TOKT_COLON)
    {
        /* note and skip the colon */
        has_colon = TRUE;
        G_tok->next();
    }

    /* if there's a colon, parse the superclass list */
    if (has_colon)
        G_prs->parse_superclass_list(0, obj->get_superclass_list());

    /* next we need a left brace '{' */
    if (G_tok->cur() != TOKT_LBRACE)
    {
        G_tok->log_error_curtok(TCERR_INLINE_OBJ_REQ_LBRACE);
        return 0;
    }

    /* skip the brace */
    G_tok->next();

    /* parse the property list */
    int err = FALSE;
    tcprs_term_info outer_term;
    if (!G_prs->parse_obj_prop_list(
        &err, obj, 0, FALSE, FALSE, TRUE, TRUE, &outer_term, &outer_term))
        return 0;

    /* return the object node */
    return obj;
}